

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall StabilizerOrbits::orbitalFixing(StabilizerOrbits *this,HighsDomain *domain)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pHVar9;
  pointer pHVar10;
  undefined1 auVar11 [16];
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  HighsInt j;
  long lVar16;
  HighsDomainChange boundchg;
  HighsInt oldNumFixed;
  int local_50;
  int local_4c;
  
  local_50 = HighsSymmetries::propagateOrbitopes(this->symmetries,domain);
  if ((domain->infeasible_ == false) &&
     ((this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    piVar6 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar7 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_4c = 0;
    iVar1 = local_4c;
LAB_002f4f84:
    local_4c = iVar1;
    if (local_4c < (int)((ulong)((long)piVar6 - (long)piVar7) >> 2) + -1) {
      lVar13 = (long)local_4c;
      piVar8 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (long)piVar8[lVar13];
      iVar1 = local_4c + 1;
      iVar12 = piVar8[lVar13 + 1];
      lVar14 = lVar16;
      do {
        if (iVar12 <= lVar14) goto LAB_002f4f84;
        iVar15 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        dVar3 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15];
        lVar14 = lVar14 + 1;
        pdVar2 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar15;
      } while ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2)));
      if (iVar15 != -1) {
        pHVar9 = (domain->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar10 = (domain->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar15 = local_50;
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          for (; lVar16 < iVar12; lVar16 = lVar16 + 1) {
            uVar5 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar16];
            dVar3 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[(int)uVar5];
            if ((dVar3 != 0.0) || (NAN(dVar3))) {
              iVar15 = iVar15 + 1;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = (ulong)uVar5 + 0x100000000;
              HighsDomain::changeBound
                        (domain,(HighsDomainChange)(auVar11 << 0x40),(Reason)0xfffffffe);
              if (domain->infeasible_ != false) {
                return iVar15;
              }
              iVar12 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13 + 1];
            }
          }
        }
        else {
          for (; lVar16 < iVar12; lVar16 = lVar16 + 1) {
            iVar4 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar16];
            dVar3 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[iVar4];
            if ((dVar3 != 1.0) || (NAN(dVar3))) {
              iVar15 = iVar15 + 1;
              boundchg.column = iVar4;
              boundchg.boundval = 1.0;
              boundchg.boundtype = kLower;
              HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
              if (domain->infeasible_ != false) {
                return iVar15;
              }
              iVar12 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13 + 1];
            }
          }
        }
        iVar12 = iVar15 - local_50;
        if (iVar15 != local_50) {
          HighsDomain::propagate(domain);
          if (domain->infeasible_ != false) {
            return iVar15;
          }
          local_50 = iVar15;
          iVar1 = local_4c + 1;
          if (iVar12 < (int)((ulong)((long)(domain->domchgstack_).
                                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(domain->domchgstack_).
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) -
                       (int)((ulong)((long)pHVar10 - (long)pHVar9) >> 4)) {
            iVar1 = 0;
          }
        }
      }
      goto LAB_002f4f84;
    }
  }
  return local_50;
}

Assistant:

HighsInt StabilizerOrbits::orbitalFixing(HighsDomain& domain) const {
  HighsInt numFixed = symmetries->propagateOrbitopes(domain);
  if (domain.infeasible() || orbitCols.empty()) return numFixed;

  HighsInt numOrbits = orbitStarts.size() - 1;
  for (HighsInt i = 0; i < numOrbits; ++i) {
    HighsInt fixcol = -1;
    for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
      if (domain.isFixed(orbitCols[j])) {
        fixcol = orbitCols[j];
        break;
      }
    }

    if (fixcol != -1) {
      HighsInt oldNumFixed = numFixed;
      auto oldSize = domain.getDomainChangeStack().size();
      if (domain.col_lower_[fixcol] == 1.0) {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_lower_[orbitCols[j]] == 1.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kLower, orbitCols[j], 1.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      } else {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_upper_[orbitCols[j]] == 0.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kUpper, orbitCols[j], 0.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      }

      HighsInt newFixed = numFixed - oldNumFixed;

      if (newFixed != 0) {
        domain.propagate();
        if (domain.infeasible()) return numFixed;
        if ((HighsInt)(domain.getDomainChangeStack().size() - oldSize) >
            newFixed)
          i = -1;
      }
    }
  }

  return numFixed;
}